

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::location_contents(Parser *this,Location *loc)

{
  ulong uVar1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  csubstr cVar5;
  char msg [39];
  basic_substring<char> local_38;
  char local_28 [24];
  
  if ((this->m_buf).len <= (loc->super_LineCol).offset) {
    builtin_strncpy(local_28,"oc.offset < m_buf.len)",0x17);
    local_38.str = (char *)0x6166206b63656863;
    local_38.len._0_1_ = 'i';
    local_38.len._1_1_ = 'l';
    local_38.len._2_1_ = 'e';
    local_38.len._3_1_ = 'd';
    local_38.len._4_1_ = ':';
    local_38.len._5_1_ = ' ';
    local_38.len._6_1_ = '(';
    local_38.len._7_1_ = 'l';
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        cVar5 = (csubstr)(*pcVar2)();
        return cVar5;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f8e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f8e) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_38,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar1 = (loc->super_LineCol).offset;
  if (uVar1 <= (this->m_buf).len) {
    basic_substring<char>::basic_substring
              (&local_38,(this->m_buf).str + uVar1,(this->m_buf).len - uVar1);
    cVar5.len = local_38.len;
    cVar5.str = local_38.str;
    return cVar5;
  }
  if ((s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar2 = (code *)swi(3);
      cVar5 = (csubstr)(*pcVar2)();
      return cVar5;
    }
  }
  handle_error(0x1fe047,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

csubstr Parser::location_contents(Location const& loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, loc.offset < m_buf.len);
    return m_buf.sub(loc.offset);
}